

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-create-socket-early.c
# Opt level: O3

int run_test_tcp_create_early_accept(void)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  int64_t eval_b_4;
  int64_t eval_b_1;
  uv_connect_t connect_req;
  uv_tcp_t client;
  uv_tcp_t server;
  long local_238 [2];
  undefined8 local_228;
  long local_220 [13];
  long local_1b8 [27];
  long local_e0 [27];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,local_1b8);
  local_e0[0] = (long)iVar1;
  local_220[0] = 0;
  if (local_e0[0] == 0) {
    iVar1 = uv_tcp_init(uVar2,local_e0);
    local_220[0] = (long)iVar1;
    local_238[0] = 0;
    if (local_220[0] != 0) goto LAB_001cc411;
    iVar1 = uv_tcp_bind(local_e0,local_1b8,0);
    local_220[0] = (long)iVar1;
    local_238[0] = 0;
    if (local_220[0] != 0) goto LAB_001cc420;
    iVar1 = uv_listen(local_e0,0x80,on_connection);
    local_220[0] = (long)iVar1;
    local_238[0] = 0;
    if (local_220[0] != 0) goto LAB_001cc42f;
    uVar2 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_238);
    local_1b8[0] = (long)iVar1;
    local_220[0] = 0;
    if (local_1b8[0] != 0) goto LAB_001cc43e;
    iVar1 = uv_tcp_init(uVar2,local_1b8);
    local_220[0] = (long)iVar1;
    if (local_220[0] != 0) goto LAB_001cc450;
    iVar1 = uv_tcp_connect(local_220,local_1b8,local_238,on_connect);
    local_228 = 0;
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      local_238[0] = 0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (local_238[0] == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001cc46e;
    }
  }
  else {
    run_test_tcp_create_early_accept_cold_1();
LAB_001cc411:
    run_test_tcp_create_early_accept_cold_2();
LAB_001cc420:
    run_test_tcp_create_early_accept_cold_3();
LAB_001cc42f:
    run_test_tcp_create_early_accept_cold_4();
LAB_001cc43e:
    run_test_tcp_create_early_accept_cold_5();
LAB_001cc450:
    run_test_tcp_create_early_accept_cold_6();
  }
  run_test_tcp_create_early_accept_cold_7();
LAB_001cc46e:
  plVar3 = local_238;
  run_test_tcp_create_early_accept_cold_8();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar3,0);
  return iVar1;
}

Assistant:

TEST_IMPL(tcp_create_early_accept) {
  uv_tcp_t client, server;
  uv_connect_t connect_req;

  tcp_listener(uv_default_loop(), &server);
  tcp_connector(uv_default_loop(), &client, &connect_req);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}